

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O1

bool __thiscall
tinyusdz::crate::CrateReader::ReadCompressedPaths(CrateReader *this,uint64_t maxNumPaths)

{
  uint64_t uVar1;
  StreamReader *pSVar2;
  byte bVar3;
  _Bit_type *p_Var4;
  _Alloc_hider _Var5;
  bool bVar6;
  bool bVar7;
  ulong uVar8;
  _Bit_type *__n;
  size_t __n_00;
  char *pcVar9;
  ostream *poVar10;
  ulong uVar11;
  pointer pcVar12;
  vector<int,_std::allocator<int>_> *pvVar13;
  long lVar14;
  vector<int,_std::allocator<int>_> *pvVar15;
  size_t nbytes;
  _Bit_type *__n_01;
  _Alloc_hider _Var16;
  int iVar17;
  char *pcVar18;
  size_type __new_size;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar19;
  ulong uVar20;
  vector<int,_std::allocator<int>_> *pvVar21;
  string *err;
  size_t nbytes_2;
  uint64_t numEncodedPaths;
  size_t sumDecodedPaths;
  vector<bool,_std::allocator<bool>_> visit_table;
  uint64_t compElementTokenIndexesSize;
  vector<unsigned_int,_std::allocator<unsigned_int>_> pathIndexes;
  vector<char,_std::allocator<char>_> compBuffer;
  vector<int,_std::allocator<int>_> jumps;
  vector<int,_std::allocator<int>_> elementTokenIndexes;
  BuildDecompressedPathsArg arg;
  vector<char,_std::allocator<char>_> workingSpace;
  ostringstream ss_e;
  pointer local_3b0;
  undefined1 local_3a8 [8];
  vector<bool,_std::allocator<bool>_> local_3a0;
  string local_378;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_358;
  vector<char,_std::allocator<char>_> local_340;
  vector<int,_std::allocator<int>_> local_328;
  vector<int,_std::allocator<int>_> local_308;
  undefined1 local_2e8 [16];
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_2d8;
  size_t sStack_2c0;
  Path local_2b8;
  long *local_1e0 [2];
  long local_1d0 [2];
  vector<char,_std::allocator<char>_> local_1c0;
  undefined1 local_1a8 [32];
  _Alloc_hider local_188;
  size_type local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  _Alloc_hider local_168;
  size_type local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  _Alloc_hider local_148;
  size_type local_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  _Alloc_hider local_128;
  size_type local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  _Alloc_hider local_108;
  size_type local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  bool local_e8;
  storage_t<tinyusdz::Path::PathType> local_e4;
  bool local_e0;
  
  local_358.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (uint32_t *)0x0;
  local_358.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_358.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_308.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_308.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int32_t *)0x0;
  local_308.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_328.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_328.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int32_t *)0x0;
  local_328.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  bVar6 = StreamReader::read8(this->_sr,(uint64_t *)&local_3b0);
  if ((bVar6) && (local_3b0 <= maxNumPaths)) {
    uVar8 = (long)local_3b0 * 0xc + this->_memoryUsage;
    this->_memoryUsage = uVar8;
    if ((this->_config).maxMemoryBudget < uVar8) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"ReadCompressedPaths",0x13);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
      iVar17 = 0x1455;
    }
    else {
      ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                (&local_358,(size_type)local_3b0);
      ::std::vector<int,_std::allocator<int>_>::resize(&local_308,(size_type)local_3b0);
      ::std::vector<int,_std::allocator<int>_>::resize(&local_328,(size_type)local_3b0);
      __n = (_Bit_type *)Usd_IntegerCompression::GetCompressedBufferSize((size_t)local_3b0);
      __n_00 = Usd_IntegerCompression::GetDecompressionWorkingSpaceSize((size_t)local_3b0);
      pcVar9 = (char *)(this->_memoryUsage + (long)__n);
      this->_memoryUsage = (uint64_t)pcVar9;
      pcVar18 = (char *)(this->_config).maxMemoryBudget;
      if (pcVar18 < pcVar9) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"ReadCompressedPaths",0x13);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
        iVar17 = 0x145d;
      }
      else {
        this->_memoryUsage = (uint64_t)(pcVar9 + __n_00);
        if (pcVar9 + __n_00 <= pcVar18) {
          ::std::vector<char,_std::allocator<char>_>::vector
                    (&local_340,(size_type)__n,(allocator_type *)local_1a8);
          ::std::vector<char,_std::allocator<char>_>::vector
                    (&local_1c0,__n_00,(allocator_type *)local_1a8);
          bVar6 = StreamReader::read8(this->_sr,(uint64_t *)&local_3a0);
          p_Var4 = local_3a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
          if (!bVar6) goto LAB_001cdc71;
          if (__n < local_3a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                       ,0x56);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"ReadCompressedPaths",0x13);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
            poVar10 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1a8,0x146d);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
            pcVar18 = "Invalid Compressed PathIndexes size.";
LAB_001cdc59:
            lVar14 = 0x24;
            goto LAB_001cdd51;
          }
          uVar1 = this->_memoryUsage;
          this->_memoryUsage =
               (long)local_3a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + uVar1;
          if ((char *)(this->_config).maxMemoryBudget <
              (char *)((long)local_3a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + uVar1
                      )) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                       ,0x56);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"ReadCompressedPaths",0x13);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
            iVar17 = 0x1470;
LAB_001cdd2c:
            poVar10 = (ostream *)::std::ostream::operator<<(local_1a8,iVar17);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
            pcVar18 = "Reached to max memory budget.";
            lVar14 = 0x1d;
            goto LAB_001cdd51;
          }
          pSVar2 = this->_sr;
          uVar1 = pSVar2->idx_;
          __n_01 = (_Bit_type *)((char *)pSVar2->length_ + -uVar1);
          if ((char *)((long)local_3a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + uVar1
                      ) <= (char *)pSVar2->length_) {
            __n_01 = local_3a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
          }
          if ((_Bit_type *)((long)__n_01 - 1U) <
              local_3a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_p) {
            memcpy(local_340.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start,pSVar2->binary_ + uVar1,(size_t)__n_01);
            pSVar2->idx_ = (uint64_t)(pSVar2->idx_ + (long)__n_01);
          }
          else {
            __n_01 = (_Bit_type *)0x0;
          }
          if (p_Var4 == __n_01) {
            pvVar19 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_1a8 + 0x10);
            local_1a8._8_8_ = 0;
            local_1a8[0x10] = '\0';
            local_1a8._0_8_ = pvVar19;
            Usd_IntegerCompression::DecompressFromBuffer
                      (local_340.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start,
                       (size_t)local_3a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                       local_358.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start,(size_t)local_3b0,
                       (string *)local_1a8,
                       local_1c0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start);
            if (local_1a8._8_8_ != 0) {
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_2e8,"Failed to decode pathIndexes\n",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_1a8);
              ::std::__cxx11::string::_M_append((char *)&this->_err,local_2e8._0_8_);
              if ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2e8._0_8_ !=
                  (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_2e8 + 0x10)) {
                operator_delete((void *)local_2e8._0_8_,
                                (ulong)((long)local_2d8.
                                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                              ._M_impl.super__Vector_impl_data._M_start + 1));
              }
              if ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1a8._0_8_ != pvVar19)
              {
                pvVar15 = (vector<int,_std::allocator<int>_> *)
                          CONCAT71(local_1a8._17_7_,local_1a8[0x10]);
                pvVar19 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1a8._0_8_;
LAB_001cdf29:
                operator_delete(pvVar19,(ulong)((long)&(pvVar15->
                                                       super__Vector_base<int,_std::allocator<int>_>
                                                       )._M_impl.super__Vector_impl_data._M_start +
                                               1));
              }
              goto LAB_001cdddc;
            }
            if ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1a8._0_8_ != pvVar19) {
              operator_delete((void *)local_1a8._0_8_,CONCAT71(local_1a8._17_7_,local_1a8[0x10]) + 1
                             );
            }
            bVar6 = StreamReader::read8(this->_sr,(uint64_t *)&local_378);
            _Var5._M_p = local_378._M_dataplus._M_p;
            if (!bVar6) goto LAB_001cdc71;
            if (__n < local_378._M_dataplus._M_p) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                         ,0x56);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"ReadCompressedPaths",0x13);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
              iVar17 = 0x148f;
LAB_001ce01d:
              poVar10 = (ostream *)::std::ostream::operator<<(local_1a8,iVar17);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
              pcVar18 = "Invalid Compressed elementTokenIndexes size.";
              lVar14 = 0x2c;
LAB_001cdd51:
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,pcVar18,lVar14);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
              ::std::__cxx11::stringbuf::str();
              ::std::__cxx11::string::_M_append((char *)&this->_err,local_2e8._0_8_);
              if ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2e8._0_8_ !=
                  (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_2e8 + 0x10)) {
                operator_delete((void *)local_2e8._0_8_,
                                (ulong)((long)local_2d8.
                                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                              ._M_impl.super__Vector_impl_data._M_start + 1));
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
              ::std::ios_base::~ios_base((ios_base *)local_138._M_local_buf);
              goto LAB_001cdddc;
            }
            uVar1 = this->_memoryUsage;
            this->_memoryUsage = (uint64_t)(local_378._M_dataplus._M_p + uVar1);
            if ((char *)(this->_config).maxMemoryBudget < local_378._M_dataplus._M_p + uVar1) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                         ,0x56);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"ReadCompressedPaths",0x13);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
              iVar17 = 0x1492;
              goto LAB_001cdd2c;
            }
            pSVar2 = this->_sr;
            uVar1 = pSVar2->idx_;
            _Var16._M_p = (char *)pSVar2->length_ + -uVar1;
            if (local_378._M_dataplus._M_p + uVar1 <= (char *)pSVar2->length_) {
              _Var16._M_p = local_378._M_dataplus._M_p;
            }
            if ((_Bit_type *)((long)_Var16._M_p - 1U) < local_378._M_dataplus._M_p) {
              memcpy(local_340.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start,pSVar2->binary_ + uVar1,(size_t)_Var16._M_p);
              pSVar2->idx_ = (uint64_t)(pSVar2->idx_ + (long)_Var16._M_p);
            }
            else {
              _Var16._M_p = (pointer)0x0;
            }
            if (_Var5._M_p != _Var16._M_p) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                         ,0x56);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"ReadCompressedPaths",0x13);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
              poVar10 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1a8,0x1498);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
              pcVar18 = "Failed to read elementTokenIndexes data.";
              lVar14 = 0x28;
              goto LAB_001cdd51;
            }
            local_2e8._0_8_ = local_2e8 + 0x10;
            local_2e8._8_8_ = (vector<int,_std::allocator<int>_> *)0x0;
            local_2d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)((ulong)local_2d8.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
            Usd_IntegerCompression::DecompressFromBuffer
                      (local_340.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start,(size_t)local_378._M_dataplus._M_p,
                       local_308.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start,(size_t)local_3b0,(string *)local_2e8,
                       local_1c0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start);
            if ((vector<int,_std::allocator<int>_> *)local_2e8._8_8_ !=
                (vector<int,_std::allocator<int>_> *)0x0) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                         ,0x56);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"ReadCompressedPaths",0x13);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
              poVar10 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1a8,0x14a3);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
              pcVar18 = "Failed to decode elementTokenIndexes.";
              lVar14 = 0x25;
LAB_001ce24d:
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,pcVar18,lVar14);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
              ::std::__cxx11::stringbuf::str();
              ::std::__cxx11::string::_M_append
                        ((char *)&this->_err,
                         (ulong)local_3a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
              if ((_Bit_iterator *)
                  local_3a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p !=
                  &local_3a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_finish) {
                operator_delete(local_3a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                                (long)local_3a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                      super__Bvector_impl_data._M_finish.super__Bit_iterator_base.
                                      _M_p + 1);
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
              ::std::ios_base::~ios_base((ios_base *)local_138._M_local_buf);
              pvVar15 = (vector<int,_std::allocator<int>_> *)
                        local_2d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              pvVar19 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2e8._0_8_;
              if ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2e8._0_8_ !=
                  (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_2e8 + 0x10))
              goto LAB_001cdf29;
              goto LAB_001cdddc;
            }
            if ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2e8._0_8_ !=
                (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_2e8 + 0x10)) {
              operator_delete((void *)local_2e8._0_8_,
                              (ulong)((long)local_2d8.
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            ._M_impl.super__Vector_impl_data._M_start + 1));
            }
            bVar6 = StreamReader::read8(this->_sr,(uint64_t *)&local_378);
            _Var5._M_p = local_378._M_dataplus._M_p;
            if (!bVar6) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                         ,0x56);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"ReadCompressedPaths",0x13);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
              poVar10 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1a8,0x14ac);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
              pcVar18 = "Failed to read compressed jumpsSize.";
              goto LAB_001cdc59;
            }
            if (__n < local_378._M_dataplus._M_p) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                         ,0x56);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"ReadCompressedPaths",0x13);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
              iVar17 = 0x14b1;
              goto LAB_001ce01d;
            }
            uVar1 = this->_memoryUsage;
            this->_memoryUsage = (uint64_t)(local_378._M_dataplus._M_p + uVar1);
            if ((char *)(this->_config).maxMemoryBudget < local_378._M_dataplus._M_p + uVar1) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                         ,0x56);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"ReadCompressedPaths",0x13);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
              iVar17 = 0x14b4;
              goto LAB_001cdd2c;
            }
            pSVar2 = this->_sr;
            uVar1 = pSVar2->idx_;
            _Var16._M_p = (char *)pSVar2->length_ + -uVar1;
            if (local_378._M_dataplus._M_p + uVar1 <= (char *)pSVar2->length_) {
              _Var16._M_p = local_378._M_dataplus._M_p;
            }
            if ((_Bit_type *)((long)_Var16._M_p - 1U) < local_378._M_dataplus._M_p) {
              memcpy(local_340.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start,pSVar2->binary_ + uVar1,(size_t)_Var16._M_p);
              pSVar2->idx_ = (uint64_t)(pSVar2->idx_ + (long)_Var16._M_p);
            }
            else {
              _Var16._M_p = (pointer)0x0;
            }
            if (_Var5._M_p != _Var16._M_p) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                         ,0x56);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"ReadCompressedPaths",0x13);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
              poVar10 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1a8,0x14b9);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
              pcVar18 = "Failed to read compressed jumps data.";
              lVar14 = 0x25;
              goto LAB_001cdd51;
            }
            err = (string *)local_2e8;
            local_2e8._0_8_ = local_2e8 + 0x10;
            local_2e8._8_8_ = (vector<int,_std::allocator<int>_> *)0x0;
            local_2d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)((ulong)local_2d8.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
            Usd_IntegerCompression::DecompressFromBuffer
                      (local_340.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start,(size_t)local_378._M_dataplus._M_p,
                       local_328.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start,(size_t)local_3b0,err,
                       local_1c0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start);
            if ((vector<int,_std::allocator<int>_> *)local_2e8._8_8_ !=
                (vector<int,_std::allocator<int>_> *)0x0) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                         ,0x56);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"ReadCompressedPaths",0x13);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
              poVar10 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1a8,0x14c3);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
              pcVar18 = "Failed to decode jumps.";
              lVar14 = 0x17;
              goto LAB_001ce24d;
            }
            if ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2e8._0_8_ !=
                (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_2e8 + 0x10)) {
              operator_delete((void *)local_2e8._0_8_,
                              (ulong)((long)local_2d8.
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            ._M_impl.super__Vector_impl_data._M_start + 1));
            }
            local_3a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
            local_3a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_offset = 0;
            local_3a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
            local_3a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_finish.super__Bit_iterator_base._M_offset = 0;
            local_3a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_end_of_storage = (_Bit_pointer)0x0;
            __new_size = ((long)(this->_paths).
                                super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->_paths).
                                super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                                _M_impl.super__Vector_impl_data._M_start >> 4) * 0x4ec4ec4ec4ec4ec5;
            uVar8 = this->_memoryUsage + __new_size;
            this->_memoryUsage = uVar8;
            if ((this->_config).maxMemoryBudget < uVar8) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                         ,0x56);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"ReadCompressedPaths",0x13);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
              poVar10 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1a8,0x14e3);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"Reached to max memory budget.",0x1d);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
              ::std::__cxx11::stringbuf::str();
              ::std::__cxx11::string::_M_append((char *)&this->_err,local_2e8._0_8_);
              if ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2e8._0_8_ !=
                  (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_2e8 + 0x10)) {
                operator_delete((void *)local_2e8._0_8_,
                                (ulong)((long)local_2d8.
                                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                              ._M_impl.super__Vector_impl_data._M_start + 1));
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
              ::std::ios_base::~ios_base((ios_base *)local_138._M_local_buf);
              bVar6 = false;
            }
            else {
              bVar6 = false;
              ::std::vector<bool,_std::allocator<bool>_>::resize(&local_3a0,__new_size,false);
              uVar8 = ((long)local_3a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                      (long)local_3a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8 +
                      (ulong)local_3a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
              if (uVar8 != 0) {
                uVar11 = 0;
                do {
                  uVar20 = uVar11 + 0x3f;
                  if (-1 < (long)uVar11) {
                    uVar20 = uVar11;
                  }
                  bVar3 = (byte)uVar11 & 0x3f;
                  err = (string *)(-2L << bVar3 | 0xfffffffffffffffeU >> 0x40 - bVar3);
                  *(ulong *)((long)local_3a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                            (ulong)((uVar11 & 0x800000000000003f) < 0x8000000000000001) * 8 +
                            ((long)uVar20 >> 6) * 8 + -8) =
                       *(ulong *)((long)local_3a0.super__Bvector_base<std::allocator<bool>_>._M_impl
                                        .super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                                        _M_p +
                                 (ulong)((uVar11 & 0x800000000000003f) < 0x8000000000000001) * 8 +
                                 ((long)uVar20 >> 6) * 8 + -8) & (ulong)err;
                  uVar11 = uVar11 + 1;
                } while (uVar11 < uVar8);
              }
              local_2b8._prim_part._M_dataplus._M_p = (pointer)&local_2b8._prim_part.field_2;
              local_2b8._prim_part._M_string_length = 0;
              local_2b8._prim_part.field_2._M_local_buf[0] = '\0';
              local_2b8._prop_part._M_dataplus._M_p = (pointer)&local_2b8._prop_part.field_2;
              local_2b8._prop_part._M_string_length = 0;
              local_2b8._prop_part.field_2._M_local_buf[0] = '\0';
              local_2b8._variant_part._M_dataplus._M_p = (pointer)&local_2b8._variant_part.field_2;
              local_2b8._variant_part._M_string_length = 0;
              local_2b8._variant_part.field_2._M_local_buf[0] = '\0';
              local_2b8._variant_selection_part._M_dataplus._M_p =
                   (pointer)&local_2b8._variant_selection_part.field_2;
              local_2b8._variant_selection_part._M_string_length = 0;
              local_2b8._variant_selection_part.field_2._M_local_buf[0] = '\0';
              local_2b8._variant_part_str._M_dataplus._M_p =
                   (pointer)&local_2b8._variant_part_str.field_2;
              local_2b8._variant_part_str._M_string_length = 0;
              local_2b8._variant_part_str.field_2._M_local_buf[0] = '\0';
              local_2b8._element._M_dataplus._M_p = (pointer)&local_2b8._element.field_2;
              local_2b8._element._M_string_length = 0;
              local_2b8._element.field_2._M_local_buf[0] = '\0';
              local_2b8._path_type.has_value_ = false;
              local_2b8._path_type.contained = (storage_t<tinyusdz::Path::PathType>)0x0;
              local_2b8._valid = false;
              local_2e8._0_8_ = &local_358;
              local_2e8._8_8_ = &local_308;
              local_2d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              sStack_2c0 = ((long)local_358.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)local_358.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start >> 2) - 1;
              local_188._M_p = local_1a8 + 0x30;
              local_1a8._0_8_ = local_1a8 + 0x10;
              local_1a8._8_8_ = 0;
              local_1a8[0x10] = '\0';
              local_180 = 0;
              local_178._M_local_buf[0] = '\0';
              local_168._M_p = local_1a8 + 0x50;
              local_160 = 0;
              local_158._M_local_buf[0] = '\0';
              local_148._M_p = (pointer)&local_138;
              local_140 = 0;
              local_138._M_local_buf[0] = '\0';
              local_128._M_p = (pointer)&local_118;
              local_120 = 0;
              local_118._M_local_buf[0] = '\0';
              local_108._M_p = (pointer)&local_f8;
              local_100 = 0;
              local_f8._M_local_buf[0] = '\0';
              local_e8 = false;
              local_e4 = (storage_t<tinyusdz::Path::PathType>)0x0;
              local_e0 = false;
              local_2d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)&local_328;
              local_2d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)&local_3a0;
              Path::operator=(&local_2b8,(Path *)local_1a8);
              Path::~Path((Path *)local_1a8);
              bVar7 = BuildDecompressedPathsImpl(this,(BuildDecompressedPathsArg *)local_2e8);
              if (bVar7) {
                local_3a8 = (undefined1  [8])0x0;
                pvVar15 = (vector<int,_std::allocator<int>_> *)
                          (((long)local_3a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                           (long)local_3a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) *
                           8 + (ulong)local_3a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                      super__Bvector_impl_data._M_finish.super__Bit_iterator_base.
                                      _M_offset);
                if (pvVar15 != (vector<int,_std::allocator<int>_> *)0x0) {
                  pcVar12 = (pointer)0x0;
                  pvVar13 = (vector<int,_std::allocator<int>_> *)0x0;
                  do {
                    pvVar21 = (vector<int,_std::allocator<int>_> *)
                              ((long)&pvVar13[2].super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_finish + 7);
                    if (-1 < (long)pvVar13) {
                      pvVar21 = pvVar13;
                    }
                    err = *(string **)
                           ((long)local_3a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                           (ulong)(((ulong)pvVar13 & 0x800000000000003f) < 0x8000000000000001) * 8 +
                           ((long)pvVar21 >> 6) * 8 + -8);
                    if (((ulong)err >> ((ulong)pvVar13 & 0x3f) & 1) != 0) {
                      pcVar12 = pcVar12 + 1;
                      local_3a8 = (undefined1  [8])pcVar12;
                    }
                    pvVar13 = (vector<int,_std::allocator<int>_> *)
                              ((long)&(pvVar13->super__Vector_base<int,_std::allocator<int>_>).
                                      _M_impl.super__Vector_impl_data._M_start + 1);
                  } while (pvVar13 < pvVar15);
                }
                if (local_3a8 == (undefined1  [8])local_3b0) {
                  if (pvVar15 != (vector<int,_std::allocator<int>_> *)0x0) {
                    pvVar13 = (vector<int,_std::allocator<int>_> *)0x0;
                    do {
                      pvVar21 = (vector<int,_std::allocator<int>_> *)
                                ((long)&pvVar13[2].super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_finish + 7);
                      if (-1 < (long)pvVar13) {
                        pvVar21 = pvVar13;
                      }
                      bVar3 = (byte)pvVar13 & 0x3f;
                      *(ulong *)((long)local_3a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                       super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                                       _M_p +
                                (ulong)(((ulong)pvVar13 & 0x800000000000003f) < 0x8000000000000001)
                                * 8 + ((long)pvVar21 >> 6) * 8 + -8) =
                           *(ulong *)((long)local_3a0.super__Bvector_base<std::allocator<bool>_>.
                                            _M_impl.super__Bvector_impl_data._M_start.
                                            super__Bit_iterator_base._M_p +
                                     (ulong)(((ulong)pvVar13 & 0x800000000000003f) <
                                            0x8000000000000001) * 8 + ((long)pvVar21 >> 6) * 8 + -8)
                           & (-2L << bVar3 | 0xfffffffffffffffeU >> 0x40 - bVar3);
                      pvVar13 = (vector<int,_std::allocator<int>_> *)
                                ((long)&(pvVar13->super__Vector_base<int,_std::allocator<int>_>).
                                        _M_impl.super__Vector_impl_data._M_start + 1);
                    } while (pvVar13 < pvVar15);
                  }
                  bVar6 = false;
                  err = (string *)&local_3a0;
                  bVar7 = BuildNodeHierarchy(this,&local_358,pvVar15,&local_328,
                                             (vector<bool,_std::allocator<bool>_> *)err,0,-1);
                  if (bVar7) {
                    local_3a8 = (undefined1  [8])0x0;
                    uVar8 = ((long)local_3a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                   super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p
                            - (long)local_3a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p)
                            * 8 + (ulong)local_3a0.super__Bvector_base<std::allocator<bool>_>.
                                         _M_impl.super__Bvector_impl_data._M_finish.
                                         super__Bit_iterator_base._M_offset;
                    if (uVar8 != 0) {
                      pcVar12 = (pointer)0x0;
                      uVar11 = 0;
                      do {
                        uVar20 = uVar11 + 0x3f;
                        if (-1 < (long)uVar11) {
                          uVar20 = uVar11;
                        }
                        err = *(string **)
                               ((long)local_3a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                      super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                                      _M_p +
                               (ulong)((uVar11 & 0x800000000000003f) < 0x8000000000000001) * 8 +
                               ((long)uVar20 >> 6) * 8 + -8);
                        if (((ulong)err >> (uVar11 & 0x3f) & 1) != 0) {
                          pcVar12 = pcVar12 + 1;
                          local_3a8 = (undefined1  [8])pcVar12;
                        }
                        uVar11 = uVar11 + 1;
                      } while (uVar11 < uVar8);
                    }
                    bVar6 = true;
                    if (local_3a8 != (undefined1  [8])local_3b0) {
                      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1a8,"[error]",7);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1a8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                 ,0x56);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1a8,":",1);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1a8,"ReadCompressedPaths",0x13);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1a8,"():",3);
                      poVar10 = (ostream *)
                                ::std::ostream::operator<<((ostringstream *)local_1a8,0x1522);
                      ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
                      pcVar9 = 
                      "Decoded {} paths but numEncodedPaths in BuildNodeHierarchy is {}. Possible corruption of Crate data."
                      ;
                      pcVar18 = "";
                      goto LAB_001cee3c;
                    }
                  }
                }
                else {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                             ,0x56);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,"ReadCompressedPaths",0x13);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3)
                  ;
                  poVar10 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1a8,0x150b)
                  ;
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
                  pcVar9 = 
                  "Decoded {} paths but numEncodedPaths in Crate is {}. Possible corruption of Crate data."
                  ;
                  pcVar18 = "";
LAB_001cee3c:
                  local_1e0[0] = local_1d0;
                  ::std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_1e0,pcVar9,pcVar18);
                  fmt::format<unsigned_long,unsigned_long>
                            (&local_378,(fmt *)local_1e0,(string *)local_3a8,
                             (unsigned_long *)&local_3b0,(unsigned_long *)err);
                  poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_1a8,local_378._M_dataplus._M_p,
                                       local_378._M_string_length);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_378._M_dataplus._M_p != &local_378.field_2) {
                    operator_delete(local_378._M_dataplus._M_p,
                                    local_378.field_2._M_allocated_capacity + 1);
                  }
                  if (local_1e0[0] != local_1d0) {
                    operator_delete(local_1e0[0],local_1d0[0] + 1);
                  }
                  ::std::__cxx11::stringbuf::str();
                  ::std::__cxx11::string::_M_append
                            ((char *)&this->_err,(ulong)local_378._M_dataplus._M_p);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_378._M_dataplus._M_p != &local_378.field_2) {
                    operator_delete(local_378._M_dataplus._M_p,
                                    local_378.field_2._M_allocated_capacity + 1);
                  }
                  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
                  ::std::ios_base::~ios_base((ios_base *)local_138._M_local_buf);
                  bVar6 = false;
                }
              }
              Path::~Path(&local_2b8);
            }
            if (local_3a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0)
            {
              operator_delete(local_3a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                              (long)local_3a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                    super__Bvector_impl_data._M_end_of_storage -
                              (long)local_3a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p)
              ;
              local_3a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
              local_3a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_offset = 0;
              local_3a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
              local_3a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_finish.super__Bit_iterator_base._M_offset = 0;
              local_3a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_end_of_storage = (_Bit_pointer)0x0;
            }
          }
          else {
LAB_001cdc71:
            ::std::__cxx11::string::append((char *)&this->_err);
LAB_001cdddc:
            bVar6 = false;
          }
          if (local_1c0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start != (char *)0x0) {
            operator_delete(local_1c0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_1c0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_1c0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          if (local_340.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start != (char *)0x0) {
            operator_delete(local_340.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_340.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_340.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          goto LAB_001cdaf0;
        }
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"ReadCompressedPaths",0x13);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
        iVar17 = 0x145e;
      }
    }
    poVar10 = (ostream *)::std::ostream::operator<<((ostream *)local_1a8,iVar17);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Reached to max memory budget.",0x1d);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::_M_append((char *)&this->_err,local_2e8._0_8_);
    if ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2e8._0_8_ !=
        (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_2e8 + 0x10)) {
      operator_delete((void *)local_2e8._0_8_,
                      (ulong)((long)local_2d8.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start + 1));
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    ::std::ios_base::~ios_base((ios_base *)local_138._M_local_buf);
  }
  else {
    ::std::__cxx11::string::append((char *)&this->_err);
  }
  bVar6 = false;
LAB_001cdaf0:
  if (local_328.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int32_t *)0x0) {
    operator_delete(local_328.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_328.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_328.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_308.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int32_t *)0x0) {
    operator_delete(local_308.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_308.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_308.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_358.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (uint32_t *)0x0) {
    operator_delete(local_358.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_358.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_358.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return bVar6;
}

Assistant:

bool CrateReader::ReadCompressedPaths(const uint64_t maxNumPaths) {
  std::vector<uint32_t> pathIndexes;
  std::vector<int32_t> elementTokenIndexes;
  std::vector<int32_t> jumps;

  // Read number of encoded paths.
  uint64_t numEncodedPaths;
  if (!_sr->read8(&numEncodedPaths)) {
    _err += "Failed to read the number of encoded paths.\n";
    return false;
  }

  DCOUT("maxNumPaths : " << maxNumPaths);
  DCOUT("numEncodedPaths : " << numEncodedPaths);

  // Number of compressed paths could be less than maxNumPaths,
  // but should not be greater.
  if (maxNumPaths < numEncodedPaths) {
    _err += "Size mismatch of numEncodedPaths at `PATHS` section.\n";
    return false;
  }


  // 3 = pathIndex, elementTokenIndex, jump
  CHECK_MEMORY_USAGE(size_t(numEncodedPaths) * sizeof(int32_t) * 3);

  pathIndexes.resize(static_cast<size_t>(numEncodedPaths));
  elementTokenIndexes.resize(static_cast<size_t>(numEncodedPaths));
  jumps.resize(static_cast<size_t>(numEncodedPaths));

  size_t compBufferSize = Usd_IntegerCompression::GetCompressedBufferSize(static_cast<size_t>(numEncodedPaths));
  size_t workspaceBufferSize = Usd_IntegerCompression::GetDecompressionWorkingSpaceSize(static_cast<size_t>(numEncodedPaths));
  CHECK_MEMORY_USAGE(compBufferSize);
  CHECK_MEMORY_USAGE(workspaceBufferSize);

  // Create temporary space for decompressing.
  std::vector<char> compBuffer(compBufferSize);
  std::vector<char> workingSpace(workspaceBufferSize);

  // pathIndexes.
  {
    uint64_t compPathIndexesSize;
    if (!_sr->read8(&compPathIndexesSize)) {
      _err += "Failed to read pathIndexesSize.\n";
      return false;
    }

    if (compPathIndexesSize > compBufferSize) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, "Invalid Compressed PathIndexes size.");
    }

    CHECK_MEMORY_USAGE(size_t(compPathIndexesSize));

    if (compPathIndexesSize !=
        _sr->read(size_t(compPathIndexesSize), size_t(compPathIndexesSize),
                  reinterpret_cast<uint8_t *>(compBuffer.data()))) {
      _err += "Failed to read compressed pathIndexes data.\n";
      return false;
    }

    DCOUT("comBuffer.size = " << compBuffer.size());
    DCOUT("compPathIndexesSize = " << compPathIndexesSize);

    std::string err;
    Usd_IntegerCompression::DecompressFromBuffer(
        compBuffer.data(), size_t(compPathIndexesSize), pathIndexes.data(),
        size_t(numEncodedPaths), &err, workingSpace.data());
    if (!err.empty()) {
      _err += "Failed to decode pathIndexes\n" + err;
      return false;
    }
  }

  // elementTokenIndexes.
  {
    uint64_t compElementTokenIndexesSize;
    if (!_sr->read8(&compElementTokenIndexesSize)) {
      _err += "Failed to read elementTokenIndexesSize.\n";
      return false;
    }

    if (compElementTokenIndexesSize > compBufferSize) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, "Invalid Compressed elementTokenIndexes size.");
    }

    CHECK_MEMORY_USAGE(size_t(compElementTokenIndexesSize));

    if (compElementTokenIndexesSize !=
        _sr->read(size_t(compElementTokenIndexesSize),
                  size_t(compElementTokenIndexesSize),
                  reinterpret_cast<uint8_t *>(compBuffer.data()))) {
      PUSH_ERROR("Failed to read elementTokenIndexes data.");
      return false;
    }

    std::string err;
    Usd_IntegerCompression::DecompressFromBuffer(
        compBuffer.data(), size_t(compElementTokenIndexesSize),
        elementTokenIndexes.data(), size_t(numEncodedPaths), &err,
        workingSpace.data());

    if (!err.empty()) {
      PUSH_ERROR("Failed to decode elementTokenIndexes.");
      return false;
    }
  }

  // jumps.
  {
    uint64_t compJumpsSize;
    if (!_sr->read8(&compJumpsSize)) {
      PUSH_ERROR("Failed to read compressed jumpsSize.");
      return false;
    }

    if (compJumpsSize > compBufferSize) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, "Invalid Compressed elementTokenIndexes size.");
    }

    CHECK_MEMORY_USAGE(size_t(compJumpsSize));

    if (compJumpsSize !=
        _sr->read(size_t(compJumpsSize), size_t(compJumpsSize),
                  reinterpret_cast<uint8_t *>(compBuffer.data()))) {
      PUSH_ERROR("Failed to read compressed jumps data.");
      return false;
    }

    std::string err;
    Usd_IntegerCompression::DecompressFromBuffer(
        compBuffer.data(), size_t(compJumpsSize), jumps.data(), size_t(numEncodedPaths),
        &err, workingSpace.data());

    if (!err.empty()) {
      PUSH_ERROR("Failed to decode jumps.");
      return false;
    }
  }

#ifdef TINYUSDZ_LOCAL_DEBUG_PRINT
  for (size_t i = 0; i < pathIndexes.size(); i++) {
    DCOUT("pathIndexes[" << i << "] = " << pathIndexes[i]);
  }

  for (size_t i = 0; i < elementTokenIndexes.size(); i++) {
    std::stringstream ss;
    ss << "elementTokenIndexes[" << i << "] = " << elementTokenIndexes[i];
    int32_t tokIdx = elementTokenIndexes[i];
    if (tokIdx < 0) {
      // Property Path. Need to negate it.
      tokIdx = -tokIdx;
    }
    if (auto tokv = GetToken(crate::Index(uint32_t(tokIdx)))) {
      ss << "(" << tokv.value() << ")";
    }
    ss << "\n";
    DCOUT(ss.str());
  }

  for (size_t i = 0; i < jumps.size(); i++) {
    DCOUT(fmt::format("jumps[{}] = {}", i, jumps[i]));
  }
#endif

  // For circular tree check
  std::vector<bool> visit_table;
  CHECK_MEMORY_USAGE(_paths.size()); // TODO: divide by 8?

  // `_paths` is already initialized just before calling this ReadCompressedPaths
  visit_table.resize(_paths.size());
  for (size_t i = 0; i < visit_table.size(); i++) {
    visit_table[i] = false;
  }

  // Now build the paths.
#if defined(TINYUSDZ_CRATE_USE_FOR_BASED_PATH_INDEX_DECODER)
  BuildDecompressedPathsArg arg;
  arg.pathIndexes = &pathIndexes;
  arg.elementTokenIndexes = &elementTokenIndexes;
  arg.jumps = &jumps;
  arg.visit_table = &visit_table;
  arg.startIndex = 0;
  arg.endIndex = pathIndexes.size() - 1; // or numEncodedPaths - 1
  arg.parentPath = Path();
  if (!BuildDecompressedPathsImpl(&arg)) {
    return false;
  }

#else
  if (!BuildDecompressedPathsImpl(pathIndexes, elementTokenIndexes, jumps, visit_table,
                                  /* curIndex */ 0, Path())) {
    return false;
  }
#endif

  //
  // Ensure decoded numEncodedPaths.
  //
  size_t sumDecodedPaths = 0;
  for (size_t i = 0; i < visit_table.size(); i++) {
    if (visit_table[i]) {
      sumDecodedPaths++;
    }
  }
  if (sumDecodedPaths != numEncodedPaths) {
    PUSH_ERROR_AND_RETURN(fmt::format("Decoded {} paths but numEncodedPaths in Crate is {}. Possible corruption of Crate data.",
      sumDecodedPaths, numEncodedPaths));
  }

  // Now build node hierarchy.

  // Circular referencing check should be done in BuildDecompressedPathsImpl,
  // but do check it again just in case.
  for (size_t i = 0; i < visit_table.size(); i++) {
    visit_table[i] = false;
  }
  if (!BuildNodeHierarchy(pathIndexes, elementTokenIndexes, jumps, visit_table,
                          /* curIndex */ 0, /* parent node index */ -1)) {
    return false;
  }

  sumDecodedPaths = 0;
  for (size_t i = 0; i < visit_table.size(); i++) {
    if (visit_table[i]) {
      sumDecodedPaths++;
    }
  }
  if (sumDecodedPaths != numEncodedPaths) {
    PUSH_ERROR_AND_RETURN(fmt::format("Decoded {} paths but numEncodedPaths in BuildNodeHierarchy is {}. Possible corruption of Crate data.",
      sumDecodedPaths, numEncodedPaths));
  }

  return true;
}